

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeSetConstructor
               (DynamicObject *setConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Var value;
  DynamicObject **ppDVar1;
  PropertyString *value_00;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *setConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,setConstructor,mode,3,0);
  this = RecyclableObject::GetLibrary(&setConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&setConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(0);
  AddMember(this,setConstructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).setPrototype);
  AddMember(this,setConstructor,0x124,*ppDVar1,'\0');
  AddSpeciesAccessorsToLibraryObject
            (this,setConstructor,(FunctionInfo *)JavascriptSet::EntryInfo::GetterSymbolSpecies);
  value_00 = ScriptContext::GetPropertyString(this_00,0x13d);
  AddMember(this,setConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(setConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSetConstructor(DynamicObject* setConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(setConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSet
        // so that the update is in sync with profiler
        JavascriptLibrary* library = setConstructor->GetLibrary();
        ScriptContext* scriptContext = setConstructor->GetScriptContext();
        library->AddMember(setConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(setConstructor, PropertyIds::prototype, library->setPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(setConstructor, &JavascriptSet::EntryInfo::GetterSymbolSpecies);

        library->AddMember(setConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Set), PropertyConfigurable);

        setConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }